

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O3

bool glcts::PipelineStatisticsQueryTestFunctional2::executeClearBufferfvDepthBufferTest(void *pThis)

{
  deUint32 err;
  long lVar1;
  GLfloat clear_depth;
  undefined1 local_14 [4];
  
  lVar1 = (**(code **)(**(long **)(*(long *)((long)pThis + 0x70) + 8) + 0x18))();
  (**(code **)(lVar1 + 0x1a8))(0x1801,0,local_14);
  err = (**(code **)(lVar1 + 0x800))();
  glu::checkError(err,"glClearBufferfv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                  ,0xa1f);
  return true;
}

Assistant:

bool PipelineStatisticsQueryTestFunctional2::executeClearBufferfvDepthBufferTest(void* pThis)
{
	const glw::GLfloat						clear_depth = 0.1f;
	PipelineStatisticsQueryTestFunctional2* data_ptr	= (PipelineStatisticsQueryTestFunctional2*)pThis;
	const glw::Functions&					gl			= data_ptr->m_context.getRenderContext().getFunctions();

	gl.clearBufferfv(GL_DEPTH, 0, /* drawbuffer */
					 &clear_depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClearBufferfv() call failed.");

	return true;
}